

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O2

void __thiscall r_exec::_Fact::_Fact(_Fact *this,_Fact *f)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint16_t i_1;
  uint16_t i;
  ushort uVar3;
  
  uVar3 = 0;
  LObject::LObject(&this->super_LObject,(Mem *)0x0);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Object_001d0d48;
  while( true ) {
    iVar1 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[6])(f);
    if ((ushort)iVar1 <= uVar3) break;
    iVar1 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(f,(ulong)(uint)uVar3);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,(ulong)(uint)uVar3);
    r_code::Atom::operator=
              ((Atom *)CONCAT44(extraout_var_00,iVar2),(Atom *)CONCAT44(extraout_var,iVar1));
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    iVar1 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[10])(f);
    if ((ushort)iVar1 <= uVar3) break;
    iVar1 = (*(f->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(f,(ulong)uVar3);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[0x19])(this,CONCAT44(extraout_var_01,iVar1));
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

_Fact::_Fact(_Fact *f)
{
    for (uint16_t i = 0; i < f->code_size(); ++i) {
        code(i) = f->code(i);
    }

    for (uint16_t i = 0; i < f->references_size(); ++i) {
        add_reference(f->get_reference(i));
    }
}